

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.hpp
# Opt level: O3

bool __thiscall String::toBool(String *this)

{
  usize *puVar1;
  char cVar2;
  int iVar3;
  Data *pDVar4;
  char *pcVar5;
  char *pcVar6;
  usize uVar7;
  bool bVar8;
  String local_38;
  
  pDVar4 = this->data;
  uVar7 = pDVar4->len;
  if (uVar7 == 0) {
    return false;
  }
  local_38.data = &local_38._data;
  local_38._data.ref = 0;
  local_38._data.str = "false";
  local_38._data.len = 5;
  if (uVar7 == 5) {
    iVar3 = compareIgnoreCase(this,&local_38);
    if (iVar3 == 0) {
      bVar8 = true;
      goto LAB_0010a0b9;
    }
    pDVar4 = this->data;
    uVar7 = pDVar4->len;
  }
  if (uVar7 == 1) {
    iVar3 = Memory::compare(pDVar4->str,"0",1);
    bVar8 = iVar3 == 0;
  }
  else {
    bVar8 = false;
  }
LAB_0010a0b9:
  if ((local_38.data)->ref != 0) {
    LOCK();
    puVar1 = &(local_38.data)->ref;
    *puVar1 = *puVar1 - 1;
    UNLOCK();
    if ((*puVar1 == 0) && (local_38.data != (Data *)0x0)) {
      operator_delete__(local_38.data);
    }
  }
  if (bVar8) {
    return false;
  }
  pcVar5 = operator_cast_to_char_(this);
  do {
    pcVar6 = pcVar5 + 1;
    cVar2 = *pcVar5;
    pcVar5 = pcVar6;
  } while (cVar2 == '0');
  if (cVar2 == '.') {
    do {
      pcVar5 = pcVar6;
      pcVar6 = pcVar5 + 1;
    } while (*pcVar5 == '0');
    if (*pcVar5 == '\0') {
      if (pcVar5[-1] == '0') {
        return false;
      }
      if (*this->data->str == '0') {
        return false;
      }
    }
  }
  return true;
}

Assistant:

bool toBool() const
  {
    if(data->len == 0 || equalsIgnoreCase("false") || *this == "0")
      return false;
    const char* p = *this;
    for(; *p == '0'; ++p);
    if(*p == '.')
    {
      for(++p; *p == '0'; ++p);
      if(!*p && (p[-1] == '0' || *data->str == '0'))
        return false;
    }
    return true;
  }